

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_pathmatch.c
# Opt level: O0

char * pm_slashskip(char *s)

{
  bool bVar1;
  char *s_local;
  
  s_local = s;
  while( true ) {
    bVar1 = true;
    if ((*s_local != '/') &&
       (((*s_local != '.' || (bVar1 = true, s_local[1] != '/')) && (bVar1 = false, *s_local == '.'))
       )) {
      bVar1 = s_local[1] == '\0';
    }
    if (!bVar1) break;
    s_local = s_local + 1;
  }
  return s_local;
}

Assistant:

static const char *
pm_slashskip(const char *s) {
	while ((*s == '/')
	    || (s[0] == '.' && s[1] == '/')
	    || (s[0] == '.' && s[1] == '\0'))
		++s;
	return (s);
}